

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

void __thiscall Semantic::SymbolTable::SymbolTable(SymbolTable *this)

{
  Function *this_00;
  vector<Variable_*,_std::allocator<Variable_*>_> local_a8;
  vector<Variable_*,_std::allocator<Variable_*>_> local_88;
  allocator local_69;
  string local_68;
  allocator local_41;
  string local_40;
  SymbolTable *local_10;
  SymbolTable *this_local;
  
  local_10 = this;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
  ::unordered_map(&this->classes);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>_>
  ::unordered_map(&this->freeFunctions);
  this_00 = (Function *)operator_new(0xc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"main",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"void",&local_69);
  local_88.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Variable_*,_std::allocator<Variable_*>_>::vector(&local_88);
  local_a8.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Variable_*,_std::allocator<Variable_*>_>::vector(&local_a8);
  Function::Function(this_00,PUBLIC,&local_40,&local_68,&local_88,&local_a8,0);
  std::vector<Variable_*,_std::allocator<Variable_*>_>::~vector(&local_a8);
  std::vector<Variable_*,_std::allocator<Variable_*>_>::~vector(&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  this->main = this_00;
  return;
}

Assistant:

SymbolTable() = default;